

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,TPZGeoLinear *geo,int matind,TPZGeoMesh *mesh
          )

{
  int64_t iVar1;
  long lVar2;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018aa910;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018aa568,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018aa268;
  (this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018b4b30;
  iVar1 = (geo->super_TPZNodeRep<2,_pztopology::TPZLine>).fNodeIndexes[1];
  (this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0] =
       (geo->super_TPZNodeRep<2,_pztopology::TPZLine>).fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1] = iVar1;
  (this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoLinear_018b4aa8;
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TGeo &geo,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(geo) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}